

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::GridProgram::shadeVertices
          (GridProgram *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  VertexPacket *pVVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 local_68;
  undefined8 uStack_60;
  rr local_50 [16];
  rr local_40 [16];
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    rr::readVertexAttribFloat(local_40,inputs,packets[uVar3]->instanceNdx,packets[uVar3]->vertexNdx)
    ;
    rr::readVertexAttribFloat
              (local_50,inputs + 1,packets[uVar3]->instanceNdx,packets[uVar3]->vertexNdx);
    tcu::operator+((tcu *)&local_68,(Vector<float,_4> *)local_40,(Vector<float,_4> *)local_50);
    pVVar1 = packets[uVar3];
    *(undefined8 *)(pVVar1->position).m_data = local_68;
    *(undefined8 *)((pVVar1->position).m_data + 2) = uStack_60;
    rr::readVertexAttribFloat
              ((rr *)&local_68,inputs + 2,packets[uVar3]->instanceNdx,packets[uVar3]->vertexNdx);
    pVVar1 = packets[uVar3];
    *(undefined8 *)&pVVar1->outputs[0].v = local_68;
    *(undefined8 *)((long)&pVVar1->outputs[0].v + 8) = uStack_60;
  }
  return;
}

Assistant:

void GridProgram::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	for (int ndx = 0; ndx < numPackets; ++ndx)
	{
		packets[ndx]->position = rr::readVertexAttribFloat(inputs[0], packets[ndx]->instanceNdx, packets[ndx]->vertexNdx) + rr::readVertexAttribFloat(inputs[1], packets[ndx]->instanceNdx, packets[ndx]->vertexNdx);
		packets[ndx]->outputs[0] = rr::readVertexAttribFloat(inputs[2], packets[ndx]->instanceNdx, packets[ndx]->vertexNdx);
	}
}